

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O3

vm_obj_id_t __thiscall CVmTimeZone::get_history_list(CVmTimeZone *this)

{
  CVmObjPageEntry *this_00;
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  vm_obj_id_t vVar3;
  ulong uVar4;
  size_t idx;
  vmtz_trans *this_01;
  vm_val_t ele;
  vmtz_trans t_pre;
  vm_val_t local_50;
  vmtz_trans local_40;
  
  vVar3 = CVmObjList::create(0,(long)this->trans_cnt_ + 1);
  pvVar2 = sp_;
  pvVar1 = &sp_->typ;
  sp_ = sp_ + 1;
  *pvVar1 = VM_OBJ;
  (pvVar2->val).obj = vVar3;
  this_00 = G_obj_table_X.pages_[vVar3 >> 0xc] + (vVar3 & 0xfff);
  uVar4 = (ulong)**(ushort **)((long)&this_00->ptr_ + 8);
  if (uVar4 != 0) {
    CVmObjList::cons_clear((CVmObjList *)this_00,0,uVar4 - 1);
  }
  local_40.ttype = this->ttype_;
  local_40.dayno = -0x80000000;
  local_40.daytime = -0x80000000;
  local_50.val.obj = vmtz_trans::get_as_list(&local_40);
  local_50.typ = VM_OBJ;
  CVmObjList::cons_set_element((CVmObjList *)this_00,0,&local_50);
  if (0 < this->trans_cnt_) {
    this_01 = this->trans_;
    idx = 0;
    do {
      idx = idx + 1;
      local_50.val.obj = vmtz_trans::get_as_list(this_01);
      local_50.typ = VM_OBJ;
      CVmObjList::cons_set_element((CVmObjList *)this_00,idx,&local_50);
      this_01 = this_01 + 1;
    } while ((long)idx < (long)this->trans_cnt_);
  }
  sp_ = sp_ + -1;
  return vVar3;
}

Assistant:

vm_obj_id_t CVmTimeZone::get_history_list(VMG0_) const
{
    /* allocate the result list; stack it for gc protection */
    vm_obj_id_t lstid = CVmObjList::create(vmg_ FALSE, trans_cnt_ + 1);
    G_stk->push()->set_obj(lstid);
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ lstid);
    lst->cons_clear();

    /* set the special first item for the pre-establishment settings */
    vmtz_trans t_pre(INT32MINVAL, INT32MINVAL, &ttype_[0]);
    vm_val_t ele;
    ele.set_obj(t_pre.get_as_list(vmg0_));
    lst->cons_set_element(0, &ele);

    /* run through the transitions */
    vmtz_trans *t = trans_;
    for (int i = 1 ; i <= trans_cnt_ ; ++i, ++t)
    {
        /* add this transition to the list */
        ele.set_obj(t->get_as_list(vmg0_));
        lst->cons_set_element(i, &ele);
    }
    
    /* discard the gc protection and return the result list */
    G_stk->discard(1);
    return lstid;
}